

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O2

double * MatMul(double *A,int Arow,int Acol,double *B,int Brow,int Bcol)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  
  lVar9 = (long)Bcol;
  pdVar1 = (double *)malloc(Arow * lVar9 * 8);
  if (Acol == Brow) {
    uVar2 = 0;
    uVar3 = 0;
    if (0 < Acol) {
      uVar3 = (ulong)(uint)Acol;
    }
    uVar5 = 0;
    if (0 < Bcol) {
      uVar5 = (ulong)(uint)Bcol;
    }
    uVar10 = (ulong)(uint)Arow;
    if (Arow < 1) {
      uVar10 = uVar2;
    }
    for (; uVar2 != uVar10; uVar2 = uVar2 + 1) {
      pdVar6 = B;
      for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
        pdVar1[uVar2 * lVar9 + uVar7] = 0.0;
        dVar11 = 0.0;
        pdVar8 = pdVar6;
        for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          dVar11 = dVar11 + A[uVar4] * *pdVar8;
          pdVar1[uVar2 * lVar9 + uVar7] = dVar11;
          pdVar8 = pdVar8 + lVar9;
        }
        pdVar6 = pdVar6 + 1;
      }
      A = A + Acol;
    }
  }
  else {
    puts(&DAT_001086cf);
    pdVar1 = (double *)0x0;
  }
  return pdVar1;
}

Assistant:

double *MatMul(double *A, int Arow, int Acol, double *B, int Brow, int Bcol) {
    double *Out = (double *) malloc(sizeof(double) * Arow * Bcol);
    if (Acol != Brow) {
        printf("        Shit!矩阵不可乘!\n");
        return NULL;
    }
    if (Acol == Brow) {
        int i, j, k;
        for (i = 0; i < Arow; i++)
            for (j = 0; j < Bcol; j++) {
                Out[Bcol * i + j] = 0;
                for (k = 0; k < Acol; k++)
                    Out[Bcol * i + j] = Out[Bcol * i + j] + A[Acol * i + k] * B[Bcol * k + j];
            }
        return Out;
    }
}